

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidy.c
# Opt level: O2

void GetOption(TidyDoc tdoc,TidyOption topt,OptionDesc *d)

{
  FILE *__stream;
  TidyOptionId optId;
  TidyOptionType TVar1;
  TidyConfigCategory TVar2;
  TidyIterator in_RAX;
  ctmbstr ptVar3;
  ulong uVar4;
  char *pcVar5;
  ulong uVar6;
  TidyIterator pos;
  
  pos = in_RAX;
  optId = tidyOptGetId(topt);
  TVar1 = tidyOptGetType(topt);
  ptVar3 = tidyOptGetName(topt);
  d->name = ptVar3;
  TVar2 = tidyOptGetCategory(topt);
  __stream = _stderr;
  if (0xb < TVar2 - TidyDiagnostics) {
    ptVar3 = tidyLocalizedString(0x346);
    fprintf(__stream,ptVar3,(ulong)TVar2);
    fputc(10,_stderr);
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/geoffmcl[P]tidy-fork/console/tidy.c"
                  ,0x1f8,"ctmbstr ConfigCategoryId(TidyConfigCategory)");
  }
  ptVar3 = tidyErrorCodeAsKey(TVar2);
  d->cat = ptVar3;
  TVar2 = tidyOptGetCategory(topt);
  d->catid = TVar2;
  d->vals = (ctmbstr)0x0;
  d->def = (ctmbstr)0x0;
  d->haveVals = yes;
  uVar4 = (ulong)(optId - TidyBlockTags);
  if (optId - TidyBlockTags < 0x3e) {
    if ((0x1000000400010001U >> (uVar4 & 0x3f) & 1) != 0) {
      d->type = "Tag Names";
      pcVar5 = "tagX, tagY, ...";
LAB_001324f9:
      d->vals = pcVar5;
      return;
    }
    if ((0x80000020000008U >> (uVar4 & 0x3f) & 1) != 0) {
      d->type = "Encoding";
      ptVar3 = tidyOptGetEncName(tdoc,optId);
      pcVar5 = anon_var_dwarf_1b568 + 0x41;
      if (ptVar3 != (ctmbstr)0x0) {
        pcVar5 = ptVar3;
      }
      d->def = pcVar5;
      d->vals = (ctmbstr)0x0;
      return;
    }
    if (uVar4 == 0x3d) {
      d->type = "Attributes Names";
      pcVar5 = "attributeX, attributeY, ...";
      goto LAB_001324f9;
    }
  }
  if (TVar1 == TidyString) {
    d->type = "String";
    d->haveVals = no;
    ptVar3 = tidyOptGetValue(tdoc,optId);
  }
  else {
    if (TVar1 == TidyInteger) {
      TVar1 = tidyOptGetType(topt);
      if (TVar1 != TidyInteger) {
LAB_001325a3:
        d->type = "Integer";
        pcVar5 = "0, 1, 2, ...";
        if (optId == TidyWrapLen) {
          pcVar5 = "0 (no wrapping), 1, 2, ...";
        }
        d->vals = pcVar5;
        uVar6 = tidyOptGetInt(tdoc,optId);
        sprintf(d->tempdefs,"%u",uVar6 & 0xffffffff);
        d->def = d->tempdefs;
        return;
      }
      pos = tidyOptGetPickList(topt);
      ptVar3 = tidyOptGetNextPick(topt,&pos);
      if (ptVar3 == (ctmbstr)0x0) goto LAB_001325a3;
      pcVar5 = "Enum";
    }
    else {
      if (TVar1 != TidyBoolean) {
        return;
      }
      pcVar5 = "Boolean";
    }
    d->type = pcVar5;
    ptVar3 = tidyOptGetCurrPick(tdoc,optId);
  }
  d->def = ptVar3;
  return;
}

Assistant:

static void GetOption(TidyDoc tdoc,    /**< The tidy document. */
                      TidyOption topt, /**< The option to create a description for. */
                      OptionDesc *d    /**< [out] The new option description. */
                      )
{
    TidyOptionId optId = tidyOptGetId( topt );
    TidyOptionType optTyp = tidyOptGetType( topt );

    d->name = tidyOptGetName( topt );
    d->cat = ConfigCategoryId( tidyOptGetCategory( topt ) );
    d->catid = tidyOptGetCategory( topt );
    d->vals = NULL;
    d->def = NULL;
    d->haveVals = yes;

    /* Handle special cases first. */
    switch ( optId )
    {
        case TidyInlineTags:
        case TidyBlockTags:
        case TidyEmptyTags:
        case TidyPreTags:
            d->type = "Tag Names";
            d->vals = "tagX, tagY, ...";
            d->def = NULL;
            break;

        case TidyPriorityAttributes:
            d->type = "Attributes Names";
            d->vals = "attributeX, attributeY, ...";
            d->def = NULL;
            break;
            
        case TidyCharEncoding:
        case TidyInCharEncoding:
        case TidyOutCharEncoding:
            d->type = "Encoding";
            d->def = tidyOptGetEncName( tdoc, optId );
            if (!d->def)
                d->def = "?";
            d->vals = NULL;
            break;
            
            /* General case will handle remaining */
        default:
            switch ( optTyp )
        {
            case TidyBoolean:
                d->type = "Boolean";
                d->def = tidyOptGetCurrPick( tdoc, optId );
                break;
                
            case TidyInteger:
                if (hasPickList(topt))
                {
                    d->type = "Enum";
                    d->def = tidyOptGetCurrPick( tdoc, optId );
                }
                else
                {
                    uint idef;
                    d->type = "Integer";
                    if ( optId == TidyWrapLen )
                        d->vals = "0 (no wrapping), 1, 2, ...";
                    else
                        d->vals = "0, 1, 2, ...";
                    
                    idef = tidyOptGetInt( tdoc, optId );
                    sprintf(d->tempdefs, "%u", idef);
                    d->def = d->tempdefs;
                }
                break;
                
            case TidyString:
                d->type = "String";
                d->vals = NULL;
                d->haveVals = no;
                d->def = tidyOptGetValue( tdoc, optId );
                break;
        }
    }
}